

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_pool_2d_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *af,ggml_op_pool op,int k0,int k1,
                 int s0,int s1,float p0,float p1)

{
  ggml_tensor *pgVar1;
  undefined4 in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int32_t params [7];
  ggml_tensor *result;
  int in_stack_ffffffffffffffa8;
  ggml_type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  pgVar1 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(int64_t *)0x15139f);
  ggml_set_op_params((ggml_tensor *)CONCAT44(params[2],in_R9D),(void *)CONCAT44(in_R8D,in_ECX),
                     0x1513f1);
  pgVar1->op = GGML_OP_POOL_2D_BACK;
  pgVar1->src[0] = in_RSI;
  pgVar1->src[1] = in_RDX;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_pool_2d_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * af,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, af->ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D_BACK;
    result->src[0] = a;
    result->src[1] = af;

    return result;
}